

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

bool CheckEthernetV3(AmpIO *Board,uint chan)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  uint16_t phyid2;
  uint16_t phyreg21;
  uint16_t phyreg17;
  uint16_t phyid1;
  uint16_t phyCR;
  
  bVar1 = CheckRTL8211F_RegIO(Board,chan,1);
  if (bVar1) {
    phyid1 = 0;
    phyid2 = 0;
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,2,&phyid1);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PHYID1");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,3,&phyid2);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PHYID2");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(poVar2," PHYID1: ");
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
    poVar2 = std::operator<<(poVar2,0x30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyid1);
    poVar2 = std::operator<<(poVar2," (should be 001c),");
    poVar2 = std::operator<<(poVar2," PHYID2: ");
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
    poVar2 = std::operator<<(poVar2,0x30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyid2);
    poVar2 = std::operator<<(poVar2," (should be c916)");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1f,0xd08);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to set PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PAGSR to 0xd08");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x11,&phyreg17);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," Page 0xd08, Reg 17");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(poVar2," Page 0xd08, Register 17: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyreg17);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Tx Delay: ");
    pcVar4 = "ON";
    pcVar3 = "ON";
    if ((phyreg17 >> 8 & 1) == 0) {
      pcVar3 = "OFF";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x15,&phyreg21);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," Page 0xd08, Reg 21");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(poVar2," Page 0xd08, Register 21: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyreg21);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Rx Delay: ");
    if ((phyreg21 & 8) == 0) {
      pcVar4 = "OFF";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1f,0xa42);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to write PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PAGSR");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,8,0x10,&phyCR);
    if (bVar1) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar2 = std::operator<<((ostream *)&std::cout,"GMII PHY Reg 16: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyCR);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read GMII PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," Reg 16");
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = phyid2 == 0xc916 && phyid1 == 0x1c;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckEthernetV3(AmpIO &Board, unsigned int chan)
{
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;

    // Check Register I/O
    if (!CheckRTL8211F_RegIO(Board, chan, phyAddr))
        return false;

    // Check PHYID1 and PHYID2 (assumes we are on correct page)
    uint16_t phyid1 = 0, phyid2 = 0;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
        std::cout << "Failed to read PHY" << chan << " PHYID1" << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
        std::cout << "Failed to read PHY" << chan << " PHYID2" << std::endl;
    std::cout << "PHY" << chan << std::hex
              << " PHYID1: " << std::setw(4) << std::setfill('0') << phyid1 << " (should be 001c),"
              << " PHYID2: " << std::setw(4) << std::setfill('0') << phyid2 << " (should be c916)"
              << std::dec << std::endl;

    // Now, check undocumented registers 0x11 (17) and 0x15 (21) on page 0xd08
    //   Register 17, Bit 8 (0x0100) indicates state of TX_DELAY
    //   Register 21, Bit 3 (0x0008) indicates state of RX_DELAY
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, 0xd08))
        std::cout << "Failed to set PHY" << chan << " PAGSR to 0xd08" << std::endl;
    uint16_t phyreg17, phyreg21;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 17, phyreg17))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 17" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 17: " << phyreg17 << std::dec << std::endl;
    std::cout << "Tx Delay: " << ((phyreg17 & 0x0100) ? "ON" : "OFF") << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 21, phyreg21))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 21" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 21: " << phyreg21 << std::dec << std::endl;
    std::cout << "Rx Delay: " << ((phyreg21 & 0x0008) ? "ON" : "OFF") << std::endl;

    // Restore default page
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT))
        std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;

    // Check GMII to RGMII core PHY register
    // Based on the VHDL source code for this core, PHY Specific Control Register 1 should be at address 16
    uint16_t phyCR;
    if (!Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, phyCR)) {
        std::cout << "Failed to read GMII PHY" << chan << " Reg 16" << std::endl;
    }
    else {
        std::cout << std::hex << "GMII PHY Reg 16: " << phyCR << std::dec << std::endl;
    }

    return (phyid1 == 0x001c) && (phyid2 == 0xc916);
}